

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O1

void Emb_ManPrintFanio(Emb_Man_t *p)

{
  int *piVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  char Buffer [100];
  void *local_d0;
  void *local_c8;
  double local_a8;
  char local_98 [104];
  
  if (p->nObjData < 1) {
    dVar13 = 0.0;
    local_a8 = 0.0;
    uVar11 = 0;
    uVar12 = 0;
  }
  else {
    piVar2 = p->pObjData;
    uVar8 = 0;
    iVar4 = 0;
    iVar7 = 0;
    uVar12 = 0;
    uVar11 = 0;
    do {
      if (piVar2 == (int *)0x0) {
        uVar11 = 0;
        uVar12 = 0;
        iVar7 = 0;
        iVar4 = 0;
        break;
      }
      uVar9 = piVar2[uVar8];
      if ((uVar8 != 0) && ((uVar9 & 3) == 0)) {
        uVar10 = uVar9 >> 4;
        uVar5 = piVar2[uVar8 + 1];
        iVar7 = iVar7 + uVar10;
        iVar4 = iVar4 + uVar5;
        if (uVar11 <= uVar10) {
          uVar11 = uVar10;
        }
        if ((int)uVar12 <= (int)uVar5) {
          uVar12 = uVar5;
        }
      }
      uVar9 = piVar2[uVar8 + 1] + (uVar9 >> 4) + (int)uVar8 + 5;
      uVar8 = (ulong)uVar9;
    } while ((int)uVar9 < p->nObjData);
    local_a8 = (double)iVar7;
    dVar13 = (double)iVar4;
  }
  uVar9 = uVar11;
  if (1 < uVar11) {
    uVar10 = 0;
    uVar9 = 0;
    uVar5 = uVar11 - 1;
    if (uVar5 != 0) {
      do {
        uVar9 = uVar10 + 1;
        bVar3 = 9 < uVar5;
        uVar5 = uVar5 / 10;
        uVar10 = uVar9;
      } while (bVar3);
    }
  }
  uVar9 = uVar9 * 10 + 10;
  uVar5 = uVar12;
  if (1 < uVar12) {
    uVar6 = 0;
    uVar5 = 0;
    uVar10 = uVar12 - 1;
    if (uVar10 != 0) {
      do {
        uVar5 = uVar6 + 1;
        bVar3 = 9 < uVar10;
        uVar10 = uVar10 / 10;
        uVar6 = uVar5;
      } while (bVar3);
    }
  }
  uVar5 = uVar5 * 10 + 10;
  if ((int)uVar5 < (int)uVar9) {
    uVar5 = uVar9;
  }
  uVar9 = 0x10;
  if (0xe < uVar5 - 1) {
    uVar9 = uVar5;
  }
  if (uVar9 == 0) {
    local_c8 = (void *)0x0;
  }
  else {
    local_c8 = malloc((long)(int)uVar9 * 4);
  }
  local_d0 = (void *)0x0;
  memset(local_c8,0,(long)(int)uVar5 << 2);
  if (uVar9 != 0) {
    local_d0 = malloc((long)(int)uVar9 << 2);
  }
  memset(local_d0,0,(long)(int)uVar5 << 2);
  iVar4 = p->nObjData;
  if ((0 < iVar4) && (piVar2 = p->pObjData, piVar2 != (int *)0x0)) {
    uVar8 = 0;
    do {
      if (((int)uVar8 != 0) && (uVar9 = piVar2[uVar8], (uVar9 & 3) == 0)) {
        uVar10 = piVar2[uVar8 + 1];
        if (uVar9 < 0xa0) {
          uVar9 = uVar9 >> 4;
LAB_00686630:
          if ((int)uVar5 <= (int)uVar9) goto LAB_00686921;
          piVar1 = (int *)((long)local_c8 + (ulong)uVar9 * 4);
          *piVar1 = *piVar1 + 1;
        }
        else {
          if (uVar9 < 0x640) {
            uVar9 = uVar9 / 0xa0 + 10;
            goto LAB_00686630;
          }
          if (uVar9 < 16000) {
            uVar9 = uVar9 / 0x640 + 0x14;
            goto LAB_00686630;
          }
          if (uVar9 < 160000) {
            uVar9 = uVar9 / 16000 + 0x1e;
            goto LAB_00686630;
          }
          if (uVar9 < 1600000) {
            uVar9 = uVar9 / 160000 + 0x28;
            goto LAB_00686630;
          }
          if (uVar9 < 16000000) {
            uVar9 = uVar9 / 1600000 + 0x32;
            goto LAB_00686630;
          }
          if (uVar9 < 160000000) {
            uVar9 = uVar9 / 16000000 + 0x3c;
            goto LAB_00686630;
          }
        }
        if ((int)uVar10 < 10) {
          if ((int)uVar10 < 0) goto LAB_00686921;
        }
        else if ((int)uVar10 < 100) {
          uVar10 = uVar10 / 10 + 10;
        }
        else if ((int)uVar10 < 1000) {
          uVar10 = uVar10 / 100 + 0x14;
        }
        else if ((int)uVar10 < 10000) {
          uVar10 = uVar10 / 1000 + 0x1e;
        }
        else if ((int)uVar10 < 100000) {
          uVar10 = uVar10 / 10000 + 0x28;
        }
        else if ((int)uVar10 < 1000000) {
          uVar10 = uVar10 / 100000 + 0x32;
        }
        else {
          if (9999999 < (int)uVar10) goto LAB_00686710;
          uVar10 = uVar10 / 1000000 + 0x3c;
        }
        if ((int)uVar5 <= (int)uVar10) {
LAB_00686921:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1d1,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        piVar1 = (int *)((long)local_d0 + (ulong)uVar10 * 4);
        *piVar1 = *piVar1 + 1;
      }
LAB_00686710:
      uVar9 = ((uint)piVar2[uVar8] >> 4) + (int)uVar8 + piVar2[uVar8 + 1] + 5;
      uVar8 = (ulong)uVar9;
    } while ((int)uVar9 < iVar4);
  }
  puts("The distribution of fanins and fanouts in the network:");
  puts("         Number   Nodes with fanin  Nodes with fanout");
  if (0 < (int)uVar5) {
    uVar8 = 0;
    do {
      if ((*(int *)((long)local_c8 + uVar8 * 4) != 0) || (*(int *)((long)local_d0 + uVar8 * 4) != 0)
         ) {
        if (uVar8 < 10) {
          printf("%15d : ",uVar8 & 0xffffffff);
        }
        else {
          iVar4 = (int)((uVar8 & 0xffffffff) / 10) * -10;
          dVar14 = (double)(int)((uVar8 & 0xffffffff) / 10);
          dVar15 = pow(10.0,dVar14);
          dVar14 = pow(10.0,dVar14);
          sprintf(local_98,"%d - %d",(ulong)(uint)(((int)uVar8 + iVar4) * (int)dVar15),
                  (ulong)(((int)uVar8 + iVar4 + 1) * (int)dVar14 - 1));
          printf("%15s : ",local_98);
        }
        if (*(int *)((long)local_c8 + uVar8 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        printf("    ");
        if (*(int *)((long)local_d0 + uVar8 * 4) == 0) {
          printf("              ");
        }
        else {
          printf("%12d  ");
        }
        putchar(10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar5 != uVar8);
  }
  if (local_c8 != (void *)0x0) {
    free(local_c8);
  }
  if (local_d0 != (void *)0x0) {
    free(local_d0);
  }
  dVar15 = (double)(p->nObjs - (p->vCis->nSize + p->vCos->nSize));
  printf("Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n",local_a8 / dVar15,
         dVar13 / dVar15,(ulong)uVar11,(ulong)uVar12);
  return;
}

Assistant:

void Emb_ManPrintFanio( Emb_Man_t * p )
{
    char Buffer[100];
    Emb_Obj_t * pNode;
    Vec_Int_t * vFanins, * vFanouts;
    int nFanins, nFanouts, nFaninsMax, nFanoutsMax, nFaninsAll, nFanoutsAll;
    int i, k, nSizeMax;

    // determine the largest fanin and fanout
    nFaninsMax = nFanoutsMax = 0;
    nFaninsAll = nFanoutsAll = 0;
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);
        nFaninsAll  += nFanins;
        nFanoutsAll += nFanouts;
        nFaninsMax   = Abc_MaxInt( nFaninsMax, nFanins );
        nFanoutsMax  = Abc_MaxInt( nFanoutsMax, nFanouts );
    }

    // allocate storage for fanin/fanout numbers
    nSizeMax = Abc_MaxInt( 10 * (Abc_Base10Log(nFaninsMax) + 1), 10 * (Abc_Base10Log(nFanoutsMax) + 1) );
    vFanins  = Vec_IntStart( nSizeMax );
    vFanouts = Vec_IntStart( nSizeMax );

    // count the number of fanins and fanouts
    Emb_ManForEachNode( p, pNode, i )
    {
        if ( i == 0 ) continue; // skip const 0 obj
        nFanins  = Emb_ObjFaninNum(pNode);
        nFanouts = Emb_ObjFanoutNum(pNode);

        if ( nFanins < 10 )
            Vec_IntAddToEntry( vFanins, nFanins, 1 );
        else if ( nFanins < 100 )
            Vec_IntAddToEntry( vFanins, 10 + nFanins/10, 1 );
        else if ( nFanins < 1000 )
            Vec_IntAddToEntry( vFanins, 20 + nFanins/100, 1 );
        else if ( nFanins < 10000 )
            Vec_IntAddToEntry( vFanins, 30 + nFanins/1000, 1 );
        else if ( nFanins < 100000 )
            Vec_IntAddToEntry( vFanins, 40 + nFanins/10000, 1 );
        else if ( nFanins < 1000000 )
            Vec_IntAddToEntry( vFanins, 50 + nFanins/100000, 1 );
        else if ( nFanins < 10000000 )
            Vec_IntAddToEntry( vFanins, 60 + nFanins/1000000, 1 );

        if ( nFanouts < 10 )
            Vec_IntAddToEntry( vFanouts, nFanouts, 1 );
        else if ( nFanouts < 100 )
            Vec_IntAddToEntry( vFanouts, 10 + nFanouts/10, 1 );
        else if ( nFanouts < 1000 )
            Vec_IntAddToEntry( vFanouts, 20 + nFanouts/100, 1 );
        else if ( nFanouts < 10000 )
            Vec_IntAddToEntry( vFanouts, 30 + nFanouts/1000, 1 );
        else if ( nFanouts < 100000 )
            Vec_IntAddToEntry( vFanouts, 40 + nFanouts/10000, 1 );
        else if ( nFanouts < 1000000 )
            Vec_IntAddToEntry( vFanouts, 50 + nFanouts/100000, 1 );
        else if ( nFanouts < 10000000 )
            Vec_IntAddToEntry( vFanouts, 60 + nFanouts/1000000, 1 );
    }

    printf( "The distribution of fanins and fanouts in the network:\n" );
    printf( "         Number   Nodes with fanin  Nodes with fanout\n" );
    for ( k = 0; k < nSizeMax; k++ )
    {
        if ( vFanins->pArray[k] == 0 && vFanouts->pArray[k] == 0 )
            continue;
        if ( k < 10 )
            printf( "%15d : ", k );
        else
        {
            sprintf( Buffer, "%d - %d", (int)pow((double)10, k/10) * (k%10), (int)pow((double)10, k/10) * (k%10+1) - 1 ); 
            printf( "%15s : ", Buffer );
        }
        if ( vFanins->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanins->pArray[k] );
        printf( "    " );
        if ( vFanouts->pArray[k] == 0 )
            printf( "              " );
        else
            printf( "%12d  ", vFanouts->pArray[k] );
        printf( "\n" );
    }
    Vec_IntFree( vFanins );
    Vec_IntFree( vFanouts );

    printf( "Fanins: Max = %d. Ave = %.2f.  Fanouts: Max = %d. Ave =  %.2f.\n", 
        nFaninsMax,  1.0*nFaninsAll/Emb_ManNodeNum(p), 
        nFanoutsMax, 1.0*nFanoutsAll/Emb_ManNodeNum(p)  );
}